

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O1

void redisFree(redisContext *c)

{
  _func_void_void_ptr *p_Var1;
  
  if (c != (redisContext *)0x0) {
    redisNetClose(c);
    sdsfree(c->obuf);
    redisReaderFree(c->reader);
    free((c->tcp).host);
    free((c->tcp).source_addr);
    free((c->unix_sock).path);
    free(c->timeout);
    free(c->saddr);
    p_Var1 = c->funcs->free_privdata;
    if (p_Var1 != (_func_void_void_ptr *)0x0) {
      (*p_Var1)(c->privdata);
    }
    memset(c,0xff,0xf0);
    free(c);
    return;
  }
  return;
}

Assistant:

void redisFree(redisContext *c) {
    if (c == NULL)
        return;
    redisNetClose(c);

    sdsfree(c->obuf);
    redisReaderFree(c->reader);
    free(c->tcp.host);
    free(c->tcp.source_addr);
    free(c->unix_sock.path);
    free(c->timeout);
    free(c->saddr);
    if (c->funcs->free_privdata) {
        c->funcs->free_privdata(c->privdata);
    }
    memset(c, 0xff, sizeof(*c));
    free(c);
}